

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O0

TPZMultiphysicsCompMesh * __thiscall
TPZHybridizeHDiv::Hybridize
          (TPZHybridizeHDiv *this,TPZMultiphysicsCompMesh *multiphysics,bool group_elements,
          double Lagrange_term_multiplier)

{
  TPZMultiphysicsCompMesh *cmesh_Hybrid;
  byte in_DL;
  TPZMultiphysicsCompMesh *in_RSI;
  TPZMultiphysicsCompMesh *result;
  TPZCompMesh *cmesh;
  double in_stack_000000c0;
  TPZMultiphysicsCompMesh *in_stack_000000c8;
  TPZHybridizeHDiv *in_stack_000000d0;
  TPZCompMesh *in_stack_000000f0;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  TPZMultiphysicsCompMesh *local_48;
  TPZVec<TPZCompMesh_*> *in_stack_ffffffffffffffc8;
  TPZHybridizeHDiv *in_stack_ffffffffffffffd0;
  
  TPZMultiphysicsCompMesh::MeshVector(in_RSI);
  ComputePeriferalMaterialIds(this,(TPZVec<TPZCompMesh_*> *)multiphysics);
  TPZMultiphysicsCompMesh::MeshVector(in_RSI);
  ComputeNState(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  cmesh_Hybrid = (TPZMultiphysicsCompMesh *)
                 CreateMultiphysicsMesh(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  if (cmesh_Hybrid == (TPZMultiphysicsCompMesh *)0x0) {
    local_48 = (TPZMultiphysicsCompMesh *)0x0;
  }
  else {
    local_48 = (TPZMultiphysicsCompMesh *)
               __dynamic_cast(cmesh_Hybrid,&TPZCompMesh::typeinfo,&TPZMultiphysicsCompMesh::typeinfo
                              ,0);
  }
  CreateInterfaceElements((TPZHybridizeHDiv *)local_48,cmesh_Hybrid);
  if ((in_DL & 1) != 0) {
    GroupandCondenseElements(in_stack_000000f0);
  }
  if (local_48 == (TPZMultiphysicsCompMesh *)0x0) {
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  return local_48;
}

Assistant:

TPZMultiphysicsCompMesh *TPZHybridizeHDiv::Hybridize(TPZMultiphysicsCompMesh *multiphysics, bool group_elements, double Lagrange_term_multiplier)
{
    ComputePeriferalMaterialIds(multiphysics->MeshVector());
    ComputeNState(multiphysics->MeshVector());
//    InsertPeriferalMaterialObjects(multiphysics->MeshVector());
//    HybridizeInternalSides(multiphysics->MeshVector());
    TPZCompMesh *cmesh = CreateMultiphysicsMesh(multiphysics);
    TPZMultiphysicsCompMesh *result = dynamic_cast<TPZMultiphysicsCompMesh *>(cmesh);
    CreateInterfaceElements(result);
    if(group_elements)
    {
      GroupandCondenseElements(result);
    }
    if(!result) DebugStop();
    return result;

}